

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderRenderingPointsCase::GeometryShaderRenderingPointsCase
          (GeometryShaderRenderingPointsCase *this,Context *context,ExtParameters *extParams,
          char *name,GLenum drawcall_mode,_shader_output_type output_type)

{
  int iVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  TestError *pTVar5;
  float *pfVar6;
  uchar *puVar7;
  ulong uVar8;
  float fVar9;
  uint local_5c;
  uint local_58;
  uint n_point_2;
  uint n_point_1;
  uint unordered_elements_data_size;
  uint unordered_array_data_size;
  uint n_point;
  uint raw_array_data_size;
  uint rendertarget_width;
  uint rendertarget_height;
  _shader_output_type local_30;
  GLenum local_2c;
  _shader_output_type output_type_local;
  GLenum drawcall_mode_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  GeometryShaderRenderingPointsCase *this_local;
  
  local_30 = output_type;
  local_2c = drawcall_mode;
  _output_type_local = name;
  name_local = (char *)extParams;
  extParams_local = (ExtParameters *)context;
  context_local = (Context *)this;
  GeometryShaderRenderingCase::GeometryShaderRenderingCase
            (&this->super_GeometryShaderRenderingCase,context,extParams,name,
             "Verifies all draw calls work correctly for specific input+output+draw call mode combination"
            );
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderingPointsCase_03270a30;
  *(_shader_output_type *)&(this->super_GeometryShaderRenderingCase).field_0x304 = local_30;
  if (local_2c != 0) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,
               "Only GL_POINTS draw call mode is supported for \'points\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x3f8);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (((local_30 != SHADER_OUTPUT_TYPE_POINTS) && (local_30 != SHADER_OUTPUT_TYPE_LINE_STRIP)) &&
     (local_30 != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP)) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,
               "Unsupported output layout qualifier type requested for \'points\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x3ff);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  raw_array_data_size = 0;
  n_point = 0;
  (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[0xd])(this,1,&n_point,&raw_array_data_size);
  uVar3 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
            super_TestNode._vptr_TestNode[0xb])(this,0);
  pfVar6 = (float *)operator_new__((ulong)(uVar3 & 0xfffffffc));
  this->m_raw_array_data = pfVar6;
  unordered_elements_data_size = 0;
  do {
    if (7 < unordered_elements_data_size) {
      uVar3 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode._vptr_TestNode[0xe])(this,0);
      uVar4 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode._vptr_TestNode[0x10])(this,0);
      pfVar6 = (float *)operator_new__((ulong)(uVar3 & 0xfffffffc));
      this->m_unordered_array_data = pfVar6;
      puVar7 = (uchar *)operator_new__((ulong)uVar4);
      this->m_unordered_elements_data = puVar7;
      for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
        pfVar6 = this->m_unordered_array_data;
        pfVar2 = this->m_raw_array_data;
        uVar8 = (ulong)((7 - local_58) * 4);
        *(undefined8 *)(pfVar6 + (local_58 << 2)) = *(undefined8 *)(pfVar2 + uVar8);
        *(undefined8 *)(pfVar6 + (ulong)(local_58 << 2) + 2) = *(undefined8 *)(pfVar2 + uVar8 + 2);
      }
      for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
        this->m_unordered_elements_data[local_5c] =
             (char)((local_5c & 3) << 1) + (char)(local_5c >> 2);
      }
      return;
    }
    iVar1 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
    if (iVar1 == 0) {
      fVar9 = ((float)(unordered_elements_data_size * 5 + 1) + 0.5) / (float)n_point;
      this->m_raw_array_data[unordered_elements_data_size << 2] = fVar9 + fVar9 + -1.0;
      this->m_raw_array_data[unordered_elements_data_size * 4 + 1] =
           2.0 / (float)raw_array_data_size + 2.0 / (float)raw_array_data_size + -1.0;
      this->m_raw_array_data[unordered_elements_data_size * 4 + 2] = 0.0;
      this->m_raw_array_data[unordered_elements_data_size * 4 + 3] = 1.0;
    }
    else if (iVar1 == 1) {
      fVar9 = ((float)(unordered_elements_data_size * 7 + 3) + 0.5) / (float)n_point;
      this->m_raw_array_data[unordered_elements_data_size << 2] = fVar9 + fVar9 + -1.0;
      this->m_raw_array_data[unordered_elements_data_size * 4 + 1] =
           3.5 / (float)raw_array_data_size + 3.5 / (float)raw_array_data_size + -1.0;
      this->m_raw_array_data[unordered_elements_data_size * 4 + 2] = 0.0;
      this->m_raw_array_data[unordered_elements_data_size * 4 + 3] = 1.0;
    }
    else {
      if (iVar1 != 2) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Unsupported shader output layout qualifier requested",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x439);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      fVar9 = ((float)(unordered_elements_data_size * 6) + 0.5) / (float)n_point;
      this->m_raw_array_data[unordered_elements_data_size << 2] = fVar9 + fVar9 + -1.0;
      this->m_raw_array_data[unordered_elements_data_size * 4 + 1] = -1.0;
      this->m_raw_array_data[unordered_elements_data_size * 4 + 2] = 0.0;
      this->m_raw_array_data[unordered_elements_data_size * 4 + 3] = 1.0;
    }
    unordered_elements_data_size = unordered_elements_data_size + 1;
  } while( true );
}

Assistant:

GeometryShaderRenderingPointsCase::GeometryShaderRenderingPointsCase(Context& context, const ExtParameters& extParams,
																	 const char* name, glw::GLenum drawcall_mode,
																	 _shader_output_type output_type)
	: GeometryShaderRenderingCase(
		  context, extParams, name,
		  "Verifies all draw calls work correctly for specific input+output+draw call mode combination")
	, m_output_type(output_type)
{
	/* Sanity checks */
	if (drawcall_mode != GL_POINTS)
	{
		TCU_FAIL("Only GL_POINTS draw call mode is supported for 'points' geometry shader input layout qualifier test "
				 "implementation");
	}

	if (output_type != SHADER_OUTPUT_TYPE_POINTS && output_type != SHADER_OUTPUT_TYPE_LINE_STRIP &&
		output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP)
	{
		TCU_FAIL("Unsupported output layout qualifier type requested for 'points' geometry shader input layout "
				 "qualifier test implementation");
	}

	/* Retrieve rendertarget resolution for a single-instance case.
	 *
	 * Y coordinates will be dynamically updated in a vertex shader for
	 * multiple-instance tests. That's fine, since in multi-instanced tests
	 * we only expand the rendertarget's height; its width is unaffected.
	 */
	unsigned int rendertarget_height = 0;
	unsigned int rendertarget_width  = 0;

	getRenderTargetSize(1, &rendertarget_width, &rendertarget_height);

	/* Generate raw vertex array data. Note we do not differentiate between instanced and
	 * non-instanced cases for geometry shaders that emit points */
	const unsigned int raw_array_data_size = getRawArraysDataBufferSize(false);

	m_raw_array_data = new float[raw_array_data_size / sizeof(float)];

	for (unsigned int n_point = 0; n_point < 8 /* points, as per test spec */; ++n_point)
	{
		switch (m_output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			m_raw_array_data[n_point * 4 + 0] =
				-1 + ((float(3 + 7 * n_point) + 0.5f) / float(rendertarget_width)) * 2.0f;
			m_raw_array_data[n_point * 4 + 1] = -1 + ((float(3.0f + 0.5f)) / float(rendertarget_height)) * 2.0f;
			m_raw_array_data[n_point * 4 + 2] = 0.0f;
			m_raw_array_data[n_point * 4 + 3] = 1.0f;

			break;
		}

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			m_raw_array_data[n_point * 4 + 0] =
				-1 + ((float(1 + 5 * n_point) + 0.5f) / float(rendertarget_width)) * 2.0f;
			m_raw_array_data[n_point * 4 + 1] = -1 + (float(1.5f + 0.5f) / float(rendertarget_height)) * 2.0f;
			m_raw_array_data[n_point * 4 + 2] = 0.0f;
			m_raw_array_data[n_point * 4 + 3] = 1.0f;

			break;
		}

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			m_raw_array_data[n_point * 4 + 0] = -1 + ((float(6 * n_point) + 0.5f) / float(rendertarget_width)) * 2.0f;
			m_raw_array_data[n_point * 4 + 1] = -1.0f;
			m_raw_array_data[n_point * 4 + 2] = 0.0f;
			m_raw_array_data[n_point * 4 + 3] = 1.0f;

			break;
		}

		default:
		{
			TCU_FAIL("Unsupported shader output layout qualifier requested");
		}
		} /* switch (m_output_type) */
	}	 /* for (all points) */

	/* Generate unordered data - we do not differentiate between instanced & non-instanced cases
	 * for "points" tests
	 */
	const unsigned int unordered_array_data_size	= getUnorderedArraysDataBufferSize(false);
	const unsigned int unordered_elements_data_size = getUnorderedElementsDataBufferSize(false);

	m_unordered_array_data	= new float[unordered_array_data_size / sizeof(float)];
	m_unordered_elements_data = new unsigned char[unordered_elements_data_size];

	for (unsigned int n_point = 0; n_point < 8 /* points, as per test spec */; ++n_point)
	{
		memcpy(m_unordered_array_data + n_point * 4, m_raw_array_data + (8 - n_point - 1) * 4,
			   sizeof(float) * 4 /* components */);
	} /* for (all points) */

	for (unsigned int n_point = 0; n_point < 8 /* points, as per test spec */; ++n_point)
	{
		m_unordered_elements_data[n_point] = (unsigned char)((n_point * 2) % 8 + n_point / 4);
	} /* for (all points) */
}